

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::DockSpace(ImGuiID id,ImVec2 *size_arg,ImGuiDockNodeFlags flags,
                        ImGuiWindowClass *window_class)

{
  ImGuiWindow_conflict *host_window_00;
  bool bVar1;
  ImGuiContext_conflict *ctx_00;
  _Bool _Var2;
  ImGuiID IVar3;
  ImGuiWindow *this;
  float fVar4;
  ImGuiWindow_conflict *host_window;
  char title [256];
  ImGuiWindowFlags window_flags;
  ImVec2 local_74;
  ImVec2 size;
  ImVec2 content_avail;
  ImGuiViewportFlags local_5c;
  ImGuiViewportFlags IStack_58;
  ImGuiTabItemFlags local_54;
  ImGuiDockNodeFlags IStack_50;
  _Bool local_4c;
  _Bool _Stack_4b;
  ImGuiDockNode *local_48;
  ImGuiDockNode *node;
  ImGuiWindow_conflict *window;
  ImGuiContext_conflict *g;
  ImGuiContext_conflict *ctx;
  ImGuiWindowClass *window_class_local;
  ImGuiDockNodeFlags flags_local;
  ImVec2 *size_arg_local;
  ImGuiID id_local;
  
  ctx_00 = GImGui;
  this = GetCurrentWindow();
  if (((ctx_00->IO).ConfigFlags & 0x40U) == 0) {
    size_arg_local._4_4_ = 0;
  }
  else {
    window_class_local._4_4_ = flags;
    if ((this->SkipItems & 1U) != 0) {
      window_class_local._4_4_ = flags | 1;
    }
    if ((window_class_local._4_4_ & 0x400) != 0) {
      __assert_fail("(flags & ImGuiDockNodeFlags_DockSpace) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x3bf0,
                    "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    if (id == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x3bf1,
                    "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    local_48 = DockContextFindNodeByID(ctx_00,id);
    if (local_48 == (ImGuiDockNode *)0x0) {
      local_48 = DockContextAddNode(ctx_00,id);
      ImGuiDockNode::SetLocalFlags(local_48,0x800);
    }
    local_48->SharedFlags = window_class_local._4_4_;
    if (window_class == (ImGuiWindowClass *)0x0) {
      ImGuiWindowClass::ImGuiWindowClass((ImGuiWindowClass *)&content_avail);
    }
    else {
      content_avail.x = (float)window_class->ClassId;
      content_avail.y = (float)window_class->ParentViewportId;
      local_5c = window_class->ViewportFlagsOverrideSet;
      IStack_58 = window_class->ViewportFlagsOverrideClear;
      local_54 = window_class->TabItemFlagsOverrideSet;
      IStack_50 = window_class->DockNodeFlagsOverrideSet;
      local_4c = window_class->DockingAlwaysTabBar;
      _Stack_4b = window_class->DockingAllowUnclassed;
    }
    (local_48->WindowClass).ClassId = (ImGuiID)content_avail.x;
    (local_48->WindowClass).ParentViewportId = (ImGuiID)content_avail.y;
    (local_48->WindowClass).ViewportFlagsOverrideSet = local_5c;
    (local_48->WindowClass).ViewportFlagsOverrideClear = IStack_58;
    (local_48->WindowClass).TabItemFlagsOverrideSet = local_54;
    (local_48->WindowClass).DockNodeFlagsOverrideSet = IStack_50;
    (local_48->WindowClass).DockingAlwaysTabBar = local_4c;
    (local_48->WindowClass).DockingAllowUnclassed = _Stack_4b;
    size_arg_local._4_4_ = id;
    if ((local_48->LastFrameActive == ctx_00->FrameCount) && ((window_class_local._4_4_ & 1) == 0))
    {
      _Var2 = ImGuiDockNode::IsDockSpace(local_48);
      if (_Var2) {
        __assert_fail("node->IsDockSpace() == false && \"Cannot call DockSpace() twice a frame with the same ID\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x3c02,
                      "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                     );
      }
      ImGuiDockNode::SetLocalFlags(local_48,local_48->LocalFlags | 0x400);
    }
    else {
      ImGuiDockNode::SetLocalFlags(local_48,local_48->LocalFlags | 0x400);
      if ((window_class_local._4_4_ & 1) == 0) {
        size = GetContentRegionAvail();
        local_74 = ImFloor(size_arg);
        if (local_74.x <= 0.0) {
          fVar4 = ImMax<float>(size.x + local_74.x,4.0);
          local_74.x = fVar4;
        }
        if (local_74.y <= 0.0) {
          fVar4 = ImMax<float>(size.y + local_74.y,4.0);
          local_74.y = fVar4;
        }
        bVar1 = false;
        if (0.0 < local_74.x) {
          bVar1 = 0.0 < local_74.y;
        }
        if (!bVar1) {
          __assert_fail("size.x > 0.0f && size.y > 0.0f",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x3c15,
                        "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        local_48->Pos = (this->DC).CursorPos;
        local_48->SizeRef = local_74;
        local_48->Size = local_48->SizeRef;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff84,0.0,0.0);
        SetNextWindowPos(&local_48->Pos,0,(ImVec2 *)&stack0xffffffffffffff84);
        SetNextWindowSize(&local_48->Size,0);
        (ctx_00->NextWindowData).PosUndock = false;
        ImFormatString((char *)&host_window,0x100,"%s/DockSpace_%08X",this->Name,(ulong)id);
        PushStyleVar(8,0.0);
        Begin((char *)&host_window,(_Bool *)0x0,0x210001bb);
        PopStyleVar(1);
        host_window_00 = ctx_00->CurrentWindow;
        DockNodeSetupHostWindow(local_48,host_window_00);
        IVar3 = ImGuiWindow::GetID(this,(char *)&host_window,(char *)0x0);
        host_window_00->ChildId = IVar3;
        local_48->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
        _Var2 = ImGuiDockNode::IsRootNode(local_48);
        if (!_Var2) {
          __assert_fail("node->IsRootNode()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x3c30,
                        "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        _Var2 = ImGuiDockNode::IsLeafNode(local_48);
        if ((_Var2) && (_Var2 = ImGuiDockNode::IsCentralNode(local_48), !_Var2)) {
          ImGuiDockNode::SetLocalFlags(local_48,local_48->LocalFlags | 0x800);
        }
        DockNodeUpdate(local_48);
        End();
        ItemSize(&local_74,-1.0);
      }
      else {
        local_48->LastFrameAlive = ctx_00->FrameCount;
      }
    }
  }
  return size_arg_local._4_4_;
}

Assistant:

ImGuiID ImGui::DockSpace(ImGuiID id, const ImVec2& size_arg, ImGuiDockNodeFlags flags, const ImGuiWindowClass* window_class)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    ImGuiWindow* window = GetCurrentWindow();
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return 0;

    // Early out if parent window is hidden/collapsed
    // This is faster but also DockNodeUpdateTabBar() relies on TabBarLayout() running (which won't if SkipItems=true) to set NextSelectedTabId = 0). See #2960.
    // If for whichever reason this is causing problem we would need to ensure that DockNodeUpdateTabBar() ends up clearing NextSelectedTabId even if SkipItems=true.
    if (window->SkipItems)
        flags |= ImGuiDockNodeFlags_KeepAliveOnly;

    IM_ASSERT((flags & ImGuiDockNodeFlags_DockSpace) == 0);
    IM_ASSERT(id != 0);
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (!node)
    {
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X created\n", id);
        node = DockContextAddNode(ctx, id);
        node->SetLocalFlags(ImGuiDockNodeFlags_CentralNode);
    }
    if (window_class && window_class->ClassId != node->WindowClass.ClassId)
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X: setup WindowClass 0x%08X -> 0x%08X\n", id, node->WindowClass.ClassId, window_class->ClassId);
    node->SharedFlags = flags;
    node->WindowClass = window_class ? *window_class : ImGuiWindowClass();

    // When a DockSpace transitioned form implicit to explicit this may be called a second time
    // It is possible that the node has already been claimed by a docked window which appeared before the DockSpace() node, so we overwrite IsDockSpace again.
    if (node->LastFrameActive == g.FrameCount && !(flags & ImGuiDockNodeFlags_KeepAliveOnly))
    {
        IM_ASSERT(node->IsDockSpace() == false && "Cannot call DockSpace() twice a frame with the same ID");
        node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_DockSpace);
        return id;
    }
    node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_DockSpace);

    // Keep alive mode, this is allow windows docked into this node so stay docked even if they are not visible
    if (flags & ImGuiDockNodeFlags_KeepAliveOnly)
    {
        node->LastFrameAlive = g.FrameCount;
        return id;
    }

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);

    node->Pos = window->DC.CursorPos;
    node->Size = node->SizeRef = size;
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false;

    // FIXME-DOCK: Why do we need a child window to host a dockspace, could we host it in the existing window?
    // FIXME-DOCK: What is the reason for not simply calling BeginChild()? (OK to have a reason but should be commented)
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_DockNodeHost;
    window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoTitleBar;
    window_flags |= ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;
    window_flags |= ImGuiWindowFlags_NoBackground;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s/DockSpace_%08X", window->Name, id);

    PushStyleVar(ImGuiStyleVar_ChildBorderSize, 0.0f);
    Begin(title, NULL, window_flags);
    PopStyleVar();

    ImGuiWindow* host_window = g.CurrentWindow;
    DockNodeSetupHostWindow(node, host_window);
    host_window->ChildId = window->GetID(title);
    node->OnlyNodeWithWindows = NULL;

    IM_ASSERT(node->IsRootNode());

    // We need to handle the rare case were a central node is missing.
    // This can happen if the node was first created manually with DockBuilderAddNode() but _without_ the ImGuiDockNodeFlags_Dockspace.
    // Doing it correctly would set the _CentralNode flags, which would then propagate according to subsequent split.
    // It would also be ambiguous to attempt to assign a central node while there are split nodes, so we wait until there's a single node remaining.
    // The specific sub-property of _CentralNode we are interested in recovering here is the "Don't delete when empty" property,
    // as it doesn't make sense for an empty dockspace to not have this property.
    if (node->IsLeafNode() && !node->IsCentralNode())
        node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_CentralNode);

    // Update the node
    DockNodeUpdate(node);

    End();
    ItemSize(size);
    return id;
}